

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_noise_strength_lut_init(aom_noise_strength_lut_t *lut,int num_points)

{
  double (*__s) [2];
  int iVar1;
  
  iVar1 = 0;
  if (0 < num_points && lut != (aom_noise_strength_lut_t *)0x0) {
    lut->num_points = 0;
    __s = (double (*) [2])aom_malloc((ulong)(uint)num_points << 4);
    lut->points = __s;
    if (__s != (double (*) [2])0x0) {
      lut->num_points = num_points;
      memset(__s,0,(ulong)(uint)num_points << 4);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int aom_noise_strength_lut_init(aom_noise_strength_lut_t *lut, int num_points) {
  if (!lut) return 0;
  if (num_points <= 0) return 0;
  lut->num_points = 0;
  lut->points = (double(*)[2])aom_malloc(num_points * sizeof(*lut->points));
  if (!lut->points) return 0;
  lut->num_points = num_points;
  memset(lut->points, 0, sizeof(*lut->points) * num_points);
  return 1;
}